

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ManFree(Jf_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  long lVar2;
  int *piVar3;
  float *pfVar4;
  word *__ptr;
  word **__ptr_00;
  int iVar5;
  Jf_Par_t *pJVar6;
  int level;
  Vec_Int_t *pVVar7;
  long lVar8;
  timespec ts;
  timespec local_28;
  
  pJVar6 = p->pPars;
  if (pJVar6->fVerbose != 0) {
    if (p->pDsd != (Sdm_Man_t *)0x0) {
      Sdm_ManPrintDsdStats(p->pDsd,0);
      pJVar6 = p->pPars;
      if (pJVar6->fVerbose == 0) goto LAB_00759d09;
    }
    pVVar1 = p->vTtMem;
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      printf("Unique truth tables = %d. Memory = %.2f MB   ",
             ((double)pVVar1->nPageAlloc * 8.0 +
              (double)(pVVar1->iPage + 1) *
              (double)(1 << ((byte)pVVar1->LogPageSze & 0x1f)) * (double)pVVar1->nEntrySize * 8.0 +
             48.0) * 9.5367431640625e-07,(ulong)(uint)pVVar1->nEntries);
      level = 3;
      iVar5 = clock_gettime(3,&local_28);
      if (iVar5 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
      }
      lVar2 = p->clkStart;
      Abc_Print(level,"%s =","Time");
      Abc_Print(level,"%9.2f sec\n",(double)(lVar8 - lVar2) / 1000000.0);
      pJVar6 = p->pPars;
    }
  }
LAB_00759d09:
  if (((pJVar6->fVeryVerbose != 0) && (pJVar6->fCutMin != 0)) && (pJVar6->fFuncDsd != 0)) {
    Jf_ManProfileClasses(p);
    pJVar6 = p->pPars;
  }
  if (pJVar6->fCoarsen != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  piVar3 = p->pGia->pRefs;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    p->pGia->pRefs = (int *)0x0;
  }
  piVar3 = (p->vCuts).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vCuts).pArray = (int *)0x0;
  }
  piVar3 = (p->vArr).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vArr).pArray = (int *)0x0;
  }
  piVar3 = (p->vDep).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vDep).pArray = (int *)0x0;
  }
  pfVar4 = (p->vFlow).pArray;
  if (pfVar4 != (float *)0x0) {
    free(pfVar4);
    (p->vFlow).pArray = (float *)0x0;
  }
  pfVar4 = (p->vRefs).pArray;
  if (pfVar4 != (float *)0x0) {
    free(pfVar4);
    (p->vRefs).pArray = (float *)0x0;
  }
  if ((p->pPars->fCutMin != 0) && (p->pPars->fFuncDsd == 0)) {
    pVVar1 = p->vTtMem;
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      pVVar7 = pVVar1->vTable;
      if (pVVar7 != (Vec_Int_t *)0x0) {
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar1->vTable->pArray = (int *)0x0;
          pVVar7 = pVVar1->vTable;
          if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00759e25;
        }
        free(pVVar7);
        pVVar1->vTable = (Vec_Int_t *)0x0;
      }
LAB_00759e25:
      pVVar7 = pVVar1->vNexts;
      if (pVVar7 != (Vec_Int_t *)0x0) {
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar1->vNexts->pArray = (int *)0x0;
          pVVar7 = pVVar1->vNexts;
          if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00759e61;
        }
        free(pVVar7);
        pVVar1->vNexts = (Vec_Int_t *)0x0;
      }
    }
LAB_00759e61:
    pVVar1 = p->vTtMem;
    iVar5 = pVVar1->iPage;
    if (-1 < iVar5) {
      lVar8 = -1;
      do {
        if (pVVar1->ppPages[lVar8 + 1] != (word *)0x0) {
          free(pVVar1->ppPages[lVar8 + 1]);
          pVVar1->ppPages[lVar8 + 1] = (word *)0x0;
          iVar5 = pVVar1->iPage;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar5);
    }
    if (pVVar1->ppPages != (word **)0x0) {
      free(pVVar1->ppPages);
    }
    free(pVVar1);
  }
  pVVar7 = p->vCnfs;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vCnfs->pArray = (int *)0x0;
      pVVar7 = p->vCnfs;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00759ef5;
    }
    free(pVVar7);
    p->vCnfs = (Vec_Int_t *)0x0;
  }
LAB_00759ef5:
  iVar5 = (p->pMem).nPagesAlloc;
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      __ptr = (p->pMem).pPages[lVar8];
      if (__ptr != (word *)0x0) {
        free(__ptr);
        (p->pMem).pPages[lVar8] = (word *)0x0;
        iVar5 = (p->pMem).nPagesAlloc;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
  }
  __ptr_00 = (p->pMem).pPages;
  if (__ptr_00 != (word **)0x0) {
    free(__ptr_00);
    (p->pMem).pPages = (word **)0x0;
  }
  pVVar7 = p->vTemp;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vTemp->pArray = (int *)0x0;
      pVVar7 = p->vTemp;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00759f90;
    }
    free(pVVar7);
  }
LAB_00759f90:
  free(p);
  return;
}

Assistant:

void Jf_ManFree( Jf_Man_t * p )
{
    if ( p->pPars->fVerbose && p->pDsd )
        Sdm_ManPrintDsdStats( p->pDsd, 0 );
    if ( p->pPars->fVerbose && p->vTtMem )
    {
        printf( "Unique truth tables = %d. Memory = %.2f MB   ", Vec_MemEntryNum(p->vTtMem), Vec_MemMemory(p->vTtMem) / (1<<20) ); 
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && p->pPars->fFuncDsd )
        Jf_ManProfileClasses( p );
    if ( p->pPars->fCoarsen )
        Gia_ManCleanMark0( p->pGia );
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vArr.pArray );
    ABC_FREE( p->vDep.pArray );
    ABC_FREE( p->vFlow.pArray );
    ABC_FREE( p->vRefs.pArray );
    if ( p->pPars->fCutMin && !p->pPars->fFuncDsd )
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    Vec_IntFreeP( &p->vCnfs );
    Vec_SetFree_( &p->pMem );
    Vec_IntFreeP( &p->vTemp );
    ABC_FREE( p );
}